

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O1

MPP_RET h265e_set_extra_info(H265eCtx *ctx)

{
  undefined4 *puVar1;
  H265eStream *s_00;
  RK_U32 RVar2;
  uint *puVar3;
  long lVar4;
  RK_U8 *dst;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  H265eStream *s;
  
  puVar3 = (uint *)ctx->extra_info;
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_set_extra_info");
  }
  uVar8 = 0;
  *puVar3 = 0;
  puVar3[0x48] = 0;
  s_00 = (H265eStream *)(puVar3 + 0x38);
  h265e_stream_reset(s_00);
  lVar4 = (long)(int)*puVar3;
  (puVar3 + lVar4 * 0xc + 2)[0] = 3;
  (puVar3 + lVar4 * 0xc + 2)[1] = 0x20;
  puVar3[lVar4 * 0xc + 4] = 1;
  puVar3[lVar4 * 0xc + 7] = 0;
  *(ulong *)(puVar3 + lVar4 * 0xc + 8) = (ulong)puVar3[0x41] + *(long *)(puVar3 + 0x38);
  puVar3[lVar4 * 0xc + 10] = 0;
  puVar3[lVar4 * 0xc + 0xc] = puVar3[0x48];
  h265e_set_vps(ctx,&ctx->vps);
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_vps_write");
  }
  h265e_stream_realign(s_00);
  uVar6 = puVar3[0x41];
  h265e_stream_write_with_log(s_00,(ctx->vps).m_VPSId,4,"vps_video_parameter_set_id");
  h265e_stream_write_with_log(s_00,3,2,"vps_reserved_three_2bits");
  h265e_stream_write_with_log(s_00,0,6,"vps_reserved_zero_6bits");
  h265e_stream_write_with_log(s_00,(ctx->vps).m_maxTLayers - 1,3,"vps_max_sub_layers_minus1");
  h265e_stream_write1_with_log
            (s_00,(ctx->vps).m_bTemporalIdNestingFlag,"vps_temporal_id_nesting_flag");
  h265e_stream_write_with_log(s_00,0xffff,0x10,"vps_reserved_ffff_16bits");
  codePTL(s_00,&(ctx->vps).m_ptl,1,(ctx->vps).m_maxTLayers - 1);
  h265e_stream_write1_with_log(s_00,1,"vps_sub_layer_ordering_info_present_flag");
  do {
    h265e_stream_write_ue_with_log
              (s_00,(ctx->vps).m_maxDecPicBuffering[uVar8] - 1,"vps_max_dec_pic_buffering_minus1[i]"
              );
    h265e_stream_write_ue_with_log
              (s_00,(ctx->vps).m_numReorderPics[uVar8],"vps_num_reorder_pics[i]");
    h265e_stream_write_ue_with_log
              (s_00,(ctx->vps).m_maxLatencyIncrease[uVar8],"vps_max_latency_increase_plus1[i]");
    uVar8 = uVar8 + 1;
  } while (uVar8 <= (ctx->vps).m_maxTLayers - 1);
  if (1 < (ctx->vps).m_numHrdParameters) {
    _mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
               "vps->m_numHrdParameters <= 1","h265e_vps_write",0x144);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001d1997;
  }
  if ((ctx->vps).m_maxNuhReservedZeroLayerId != 0) {
    _mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
               "vps->m_maxNuhReservedZeroLayerId < 1","h265e_vps_write",0x145);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001d1997;
  }
  h265e_stream_write_with_log
            (s_00,(ctx->vps).m_maxNuhReservedZeroLayerId,6,"vps_max_nuh_reserved_zero_layer_id");
  (ctx->vps).m_numOpSets = 1;
  h265e_stream_write_ue_with_log(s_00,0,"vps_max_op_sets_minus1");
  if ((ctx->vps).m_numOpSets != 1) {
    uVar8 = 1;
    do {
      uVar9 = 0;
      do {
        (ctx->vps).m_layerIdIncludedFlag[uVar8 + uVar9][0] = 1;
        h265e_stream_write1_with_log(s_00,1,"layer_id_included_flag[opsIdx][i]");
        uVar5 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar5;
      } while (uVar5 <= (ctx->vps).m_maxNuhReservedZeroLayerId);
      uVar8 = uVar8 + 1;
    } while (uVar8 <= (ctx->vps).m_numOpSets - 1);
  }
  h265e_stream_write1_with_log
            (s_00,(ctx->vps).m_timingInfo.m_timingInfoPresentFlag,"vps_timing_info_present_flag");
  if ((ctx->vps).m_timingInfo.m_timingInfoPresentFlag != 0) {
    h265e_stream_write_with_log
              (s_00,(ctx->vps).m_timingInfo.m_numUnitsInTick,0x20,"vps_num_units_in_tick");
    h265e_stream_write_with_log(s_00,(ctx->vps).m_timingInfo.m_timeScale,0x20,"vps_time_scale");
    h265e_stream_write1_with_log
              (s_00,(ctx->vps).m_timingInfo.m_pocProportionalToTimingFlag,
               "vps_poc_proportional_to_timing_flag");
    if ((ctx->vps).m_timingInfo.m_pocProportionalToTimingFlag != 0) {
      h265e_stream_write_ue_with_log
                (s_00,(ctx->vps).m_timingInfo.m_numTicksPocDiffOneMinus1,
                 "vps_num_ticks_poc_diff_one_minus1");
    }
    (ctx->vps).m_numHrdParameters = 0;
    h265e_stream_write_ue_with_log(s_00,0,"vps_num_hrd_parameters");
  }
  h265e_stream_write1_with_log(s_00,0,"vps_extension_flag");
  h265e_stream_rbsp_trailing(s_00);
  h265e_stream_flush(s_00);
  if ((h265e_debug._1_1_ & 2) != 0) {
    _mpp_log_l(4,"h265e_header_gen","write pure vps head size: %d bits",(char *)0x0,
               (ulong)((puVar3[0x41] - uVar6) * 8));
  }
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_vps_write");
  }
  lVar4 = *(long *)(puVar3 + 0x38);
  uVar9 = (ulong)puVar3[0x41];
  puVar3[(long)(int)*puVar3 * 0xc + 7] =
       ((int)lVar4 + puVar3[0x41]) - puVar3[(long)(int)*puVar3 * 0xc + 8];
  puVar1 = (undefined4 *)(lVar4 + 0x30 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + 0x20 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + 0x10 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  lVar4 = (long)(int)*puVar3 + 1;
  *puVar3 = (uint)lVar4;
  (puVar3 + lVar4 * 0xc + 2)[0] = 3;
  (puVar3 + lVar4 * 0xc + 2)[1] = 0x21;
  puVar3[lVar4 * 0xc + 4] = 1;
  puVar3[lVar4 * 0xc + 7] = 0;
  *(ulong *)(puVar3 + lVar4 * 0xc + 8) = (ulong)puVar3[0x41] + *(long *)(puVar3 + 0x38);
  puVar3[lVar4 * 0xc + 10] = 0;
  puVar3[lVar4 * 0xc + 0xc] = puVar3[0x48];
  h265e_set_sps(ctx,&ctx->sps,&ctx->vps);
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_sps_write");
  }
  h265e_stream_realign(s_00);
  uVar8 = puVar3[0x41];
  h265e_stream_write_with_log(s_00,(ctx->sps).m_VPSId,4,"sps_video_parameter_set_id");
  h265e_stream_write_with_log(s_00,(ctx->sps).m_maxTLayers - 1,3,"sps_max_sub_layers_minus1");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->sps).m_bTemporalIdNestingFlag != 0),"sps_temporal_id_nesting_flag");
  codePTL(s_00,(ctx->sps).m_ptl,1,(ctx->sps).m_maxTLayers - 1);
  h265e_stream_write_ue_with_log(s_00,(ctx->sps).m_SPSId,"sps_seq_parameter_set_id");
  h265e_stream_write_ue_with_log(s_00,(ctx->sps).m_chromaFormatIdc,"chroma_format_idc");
  if ((ctx->sps).m_chromaFormatIdc == 4) {
    h265e_stream_write1_with_log(s_00,0,"separate_colour_plane_flag");
  }
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_picWidthInLumaSamples,"pic_width_in_luma_samples");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_picHeightInLumaSamples,"pic_height_in_luma_samples");
  h265e_stream_write1_with_log
            (s_00,(ctx->sps).m_conformanceWindow.m_enabledFlag,"conformance_window_flag");
  if ((ctx->sps).m_conformanceWindow.m_enabledFlag != 0) {
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_conformanceWindow.m_winLeftOffset /
                    (int)h264e_sps_to_packet::SubWidthC[(ctx->sps).m_chromaFormatIdc],
               "conf_win_left_offset");
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_conformanceWindow.m_winRightOffset /
                    (int)h264e_sps_to_packet::SubWidthC[(ctx->sps).m_chromaFormatIdc],
               "conf_win_right_offset");
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_conformanceWindow.m_winTopOffset /
                    (int)h264e_sps_to_packet::SubHeightC[(ctx->sps).m_chromaFormatIdc],
               "conf_win_top_offset");
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_conformanceWindow.m_winBottomOffset /
                    (int)h264e_sps_to_packet::SubHeightC[(ctx->sps).m_chromaFormatIdc],
               "conf_win_bottom_offset");
  }
  h265e_stream_write_ue_with_log(s_00,(ctx->sps).m_bitDepthY - 8,"bit_depth_luma_minus8");
  h265e_stream_write_ue_with_log(s_00,(ctx->sps).m_bitDepthC - 8,"bit_depth_chroma_minus8");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_bitsForPOC - 4,"log2_max_pic_order_cnt_lsb_minus4");
  h265e_stream_write1_with_log(s_00,1,"sps_sub_layer_ordering_info_present_flag");
  uVar6 = 0;
  do {
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_maxDecPicBuffering[uVar6] - 1,"sps_max_dec_pic_buffering_minus1[i]"
              );
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_numReorderPics[uVar6],"sps_num_reorder_pics[i]");
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_maxLatencyIncrease[uVar6],"sps_max_latency_increase_plus1[i]");
    uVar6 = uVar6 + 1;
  } while (uVar6 <= (ctx->sps).m_maxTLayers - 1);
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_log2MinCodingBlockSize - 3,"log2_min_coding_block_size_minus3");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_log2DiffMaxMinCodingBlockSize,"log2_diff_max_min_coding_block_size");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_quadtreeTULog2MinSize - 2,"log2_min_transform_block_size_minus2");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_quadtreeTULog2MaxSize - (ctx->sps).m_quadtreeTULog2MinSize,
             "log2_diff_max_min_transform_block_size");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_quadtreeTUMaxDepthInter - 1,"max_transform_hierarchy_depth_inter");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_quadtreeTUMaxDepthIntra - 1,"max_transform_hierarchy_depth_intra");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->sps).m_scalingListEnabledFlag != 0),"scaling_list_enabled_flag");
  RVar2 = (ctx->sps).m_scalingListEnabledFlag;
  if (RVar2 == 2) {
    _mpp_log_l(2,"h265e_header_gen","m_scalingListEnabledFlag == 2 not supported yet\n",
               "h265e_sps_write");
  }
  else if (RVar2 == 1) {
    h265e_stream_write1_with_log(s_00,0,"sps_scaling_list_data_present_flag");
  }
  h265e_stream_write1_with_log(s_00,(uint)((ctx->sps).m_useAMP != 0),"amp_enabled_flag");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->sps).m_bUseSAO != 0),"sample_adaptive_offset_enabled_flag");
  h265e_stream_write1_with_log(s_00,(uint)((ctx->sps).m_usePCM != 0),"pcm_enabled_flag");
  if ((ctx->sps).m_usePCM != 0) {
    h265e_stream_write_with_log
              (s_00,(ctx->sps).m_pcmBitDepthLuma - 1,4,"pcm_sample_bit_depth_luma_minus1");
    h265e_stream_write_with_log
              (s_00,(ctx->sps).m_pcmBitDepthChroma - 1,4,"pcm_sample_bit_depth_chroma_minus1");
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_pcmLog2MinSize - 3,"log2_min_pcm_luma_coding_block_size_minus3");
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_pcmLog2MaxSize - (ctx->sps).m_pcmLog2MinSize,
               "log2_diff_max_min_pcm_luma_coding_block_size");
    h265e_stream_write1_with_log
              (s_00,(uint)((ctx->sps).m_bPCMFilterDisableFlag != 0),"pcm_loop_filter_disable_flag");
  }
  if ((ctx->sps).m_maxTLayers == 0) {
    _mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
               "sps->m_maxTLayers > 0","h265e_sps_write",0x203);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001d1997;
  }
  h265e_stream_write_ue_with_log
            (s_00,(ctx->sps).m_RPSList.m_numberOfReferencePictureSets,"num_short_term_ref_pic_sets")
  ;
  if ((ctx->sps).m_RPSList.m_numberOfReferencePictureSets != 0) {
    uVar6 = 0;
    do {
      _mpp_log_l(4,"h265e_header_gen","todo m_numberOfReferencePictureSets",(char *)0x0);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uint)(ctx->sps).m_RPSList.m_numberOfReferencePictureSets);
  }
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->sps).m_bLongTermRefsPresent != 0),"long_term_ref_pics_present_flag");
  if ((ctx->sps).m_bLongTermRefsPresent != 0) {
    h265e_stream_write_ue_with_log
              (s_00,(ctx->sps).m_numLongTermRefPicSPS,"num_long_term_ref_pic_sps");
    if ((ctx->sps).m_numLongTermRefPicSPS != 0) {
      uVar9 = 0;
      do {
        h265e_stream_write_with_log
                  (s_00,(ctx->sps).m_ltRefPicPocLsbSps[uVar9],(ctx->sps).m_bitsForPOC,
                   "lt_ref_pic_poc_lsb_sps");
        h265e_stream_write1_with_log
                  (s_00,(ctx->sps).m_usedByCurrPicLtSPSFlag[uVar9],"used_by_curr_pic_lt_sps_flag");
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ctx->sps).m_numLongTermRefPicSPS);
    }
  }
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->sps).m_TMVPFlagsPresent != 0),"sps_temporal_mvp_enable_flag");
  h265e_stream_write1_with_log
            (s_00,(ctx->sps).m_useStrongIntraSmoothing,"sps_strong_intra_smoothing_enable_flag");
  h265e_stream_write1_with_log
            (s_00,(ctx->sps).m_vuiParametersPresentFlag,"vui_parameters_present_flag");
  if ((ctx->sps).m_vuiParametersPresentFlag != 0) {
    codeVUI(s_00,&(ctx->sps).vui);
  }
  h265e_stream_write1_with_log(s_00,0,"sps_extension_flag");
  h265e_stream_rbsp_trailing(s_00);
  h265e_stream_flush(s_00);
  if ((h265e_debug._1_1_ & 2) != 0) {
    _mpp_log_l(4,"h265e_header_gen","write pure sps head size: %d bits",(char *)0x0,
               (ulong)((puVar3[0x41] - uVar8) * 8));
  }
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_sps_write");
  }
  lVar4 = *(long *)(puVar3 + 0x38);
  uVar9 = (ulong)puVar3[0x41];
  puVar3[(long)(int)*puVar3 * 0xc + 7] =
       ((int)lVar4 + puVar3[0x41]) - puVar3[(long)(int)*puVar3 * 0xc + 8];
  puVar1 = (undefined4 *)(lVar4 + 0x30 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + 0x20 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + 0x10 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  lVar4 = (long)(int)*puVar3 + 1;
  *puVar3 = (uint)lVar4;
  (puVar3 + lVar4 * 0xc + 2)[0] = 3;
  (puVar3 + lVar4 * 0xc + 2)[1] = 0x22;
  puVar3[lVar4 * 0xc + 4] = 1;
  puVar3[lVar4 * 0xc + 7] = 0;
  *(ulong *)(puVar3 + lVar4 * 0xc + 8) = (ulong)puVar3[0x41] + *(long *)(puVar3 + 0x38);
  puVar3[lVar4 * 0xc + 10] = 0;
  puVar3[lVar4 * 0xc + 0xc] = puVar3[0x48];
  h265e_set_pps(ctx,&ctx->pps,&ctx->sps);
  h265e_stream_realign(s_00);
  uVar8 = puVar3[0x41];
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_pps_write");
  }
  h265e_stream_write_ue_with_log(s_00,(ctx->pps).m_PPSId,"pps_pic_parameter_set_id");
  h265e_stream_write_ue_with_log(s_00,(ctx->pps).m_SPSId,"pps_seq_parameter_set_id");
  h265e_stream_write1_with_log(s_00,0,"dependent_slice_segments_enabled_flag");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_outputFlagPresentFlag != 0),"output_flag_present_flag");
  h265e_stream_write_with_log
            (s_00,(ctx->pps).m_numExtraSliceHeaderBits,3,"num_extra_slice_header_bits");
  h265e_stream_write1_with_log(s_00,(ctx->pps).m_signHideFlag,"sign_data_hiding_flag");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_cabacInitPresentFlag != 0),"cabac_init_present_flag");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->pps).m_numRefIdxL0DefaultActive - 1,"num_ref_idx_l0_default_active_minus1");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->pps).m_numRefIdxL1DefaultActive - 1,"num_ref_idx_l1_default_active_minus1");
  h265e_stream_write_se_with_log(s_00,(ctx->pps).m_picInitQPMinus26,"init_qp_minus26");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_bConstrainedIntraPred != 0),"constrained_intra_pred_flag");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_useTransformSkip != 0),"transform_skip_enabled_flag");
  h265e_stream_write1_with_log(s_00,(uint)((ctx->pps).m_useDQP != 0),"cu_qp_delta_enabled_flag");
  if ((ctx->pps).m_useDQP != 0) {
    h265e_stream_write_ue_with_log(s_00,(ctx->pps).m_maxCuDQPDepth,"diff_cu_qp_delta_depth");
  }
  h265e_stream_write_se_with_log(s_00,(ctx->pps).m_chromaCbQpOffset,"pps_cb_qp_offset");
  h265e_stream_write_se_with_log(s_00,(ctx->pps).m_chromaCrQpOffset,"pps_cr_qp_offset");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_bSliceChromaQpFlag != 0),
             "pps_slice_chroma_qp_offsets_present_flag");
  h265e_stream_write1_with_log(s_00,(uint)((ctx->pps).m_bUseWeightPred != 0),"weighted_pred_flag");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_useWeightedBiPred != 0),"weighted_bipred_flag");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_transquantBypassEnableFlag != 0),
             "transquant_bypass_enable_flag");
  h265e_stream_write1_with_log(s_00,(ctx->pps).m_tiles_enabled_flag,"tiles_enabled_flag");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_entropyCodingSyncEnabledFlag != 0),
             "entropy_coding_sync_enabled_flag");
  if ((ctx->pps).m_tiles_enabled_flag != 0) {
    h265e_stream_write_ue_with_log
              (s_00,(ctx->pps).m_nNumTileColumnsMinus1,"num_tile_columns_minus1");
    h265e_stream_write_ue_with_log(s_00,(ctx->pps).m_nNumTileRowsMinus1,"num_tile_rows_minus1");
    h265e_stream_write1_with_log(s_00,(ctx->pps).m_bTileUniformSpacing,"uniform_spacing_flag");
    if ((ctx->pps).m_bTileUniformSpacing == 0) {
      if (0 < (ctx->pps).m_nNumTileColumnsMinus1) {
        lVar4 = 0;
        do {
          h265e_stream_write_ue_with_log
                    (s_00,(ctx->pps).m_nTileColumnWidthArray[lVar4] - 1,"column_width_minus1");
          lVar4 = lVar4 + 1;
        } while (lVar4 < (ctx->pps).m_nNumTileColumnsMinus1);
      }
      if (0 < (ctx->pps).m_nNumTileRowsMinus1) {
        lVar4 = 0;
        do {
          h265e_stream_write_ue_with_log
                    (s_00,(ctx->pps).m_nTileRowHeightArray[lVar4] - 1,"row_height_minus1");
          lVar4 = lVar4 + 1;
        } while (lVar4 < (ctx->pps).m_nNumTileRowsMinus1);
      }
    }
    if ((ctx->pps).m_nNumTileColumnsMinus1 + (ctx->pps).m_nNumTileRowsMinus1 == 0) {
      _mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(pps->m_nNumTileColumnsMinus1 + pps->m_nNumTileRowsMinus1) != 0","h265e_pps_write"
                 ,0x25e);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001d1997:
        abort();
      }
    }
    h265e_stream_write1_with_log
              (s_00,(uint)((ctx->pps).m_loopFilterAcrossTilesEnabledFlag != 0),
               "loop_filter_across_tiles_enabled_flag");
  }
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_LFCrossSliceBoundaryFlag != 0),
             "loop_filter_across_slices_enabled_flag");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_deblockingFilterControlPresentFlag != 0),
             "deblocking_filter_control_present_flag");
  if ((ctx->pps).m_deblockingFilterControlPresentFlag != 0) {
    h265e_stream_write1_with_log
              (s_00,(uint)((ctx->pps).m_deblockingFilterOverrideEnabledFlag != 0),
               "deblocking_filter_override_enabled_flag");
    h265e_stream_write1_with_log
              (s_00,(uint)((ctx->pps).m_picDisableDeblockingFilterFlag != 0),
               "pps_disable_deblocking_filter_flag");
    if ((ctx->pps).m_picDisableDeblockingFilterFlag == 0) {
      h265e_stream_write_se_with_log
                (s_00,(ctx->pps).m_deblockingFilterBetaOffsetDiv2,"pps_beta_offset_div2");
      h265e_stream_write_se_with_log
                (s_00,(ctx->pps).m_deblockingFilterTcOffsetDiv2,"pps_tc_offset_div2");
    }
  }
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_scalingListPresentFlag != 0),
             "pps_scaling_list_data_present_flag");
  h265e_stream_write1_with_log
            (s_00,(ctx->pps).m_listsModificationPresentFlag,"lists_modification_present_flag");
  h265e_stream_write_ue_with_log
            (s_00,(ctx->pps).m_log2ParallelMergeLevelMinus2,"log2_parallel_merge_level_minus2");
  h265e_stream_write1_with_log
            (s_00,(uint)((ctx->pps).m_sliceHeaderExtensionPresentFlag != 0),
             "slice_segment_header_extension_present_flag");
  h265e_stream_write1_with_log(s_00,0,"pps_extension_flag");
  h265e_stream_rbsp_trailing(s_00);
  h265e_stream_flush(s_00);
  if ((h265e_debug._1_1_ & 2) != 0) {
    _mpp_log_l(4,"h265e_header_gen","write pure pps size: %d bits",(char *)0x0,
               (ulong)((puVar3[0x41] - uVar8) * 8));
  }
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_pps_write");
  }
  lVar4 = *(long *)(puVar3 + 0x38);
  uVar9 = (ulong)puVar3[0x41];
  puVar3[(long)(int)*puVar3 * 0xc + 7] =
       ((int)lVar4 + puVar3[0x41]) - puVar3[(long)(int)*puVar3 * 0xc + 8];
  puVar1 = (undefined4 *)(lVar4 + 0x30 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + 0x20 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + 0x10 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  puVar1 = (undefined4 *)(lVar4 + uVar9);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  uVar6 = *puVar3;
  uVar8 = uVar6 + 1;
  *puVar3 = uVar8;
  dst = *(RK_U8 **)(puVar3 + 0x32);
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_encapsulate_nals");
  }
  uVar9 = (ulong)uVar8;
  if ((int)uVar6 < 0) {
    iVar7 = 0;
  }
  else {
    lVar4 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + *(int *)((long)puVar3 + lVar4 + 0x1c);
      lVar4 = lVar4 + 0x30;
    } while (uVar9 * 0x30 != lVar4);
    iVar7 = (iVar7 * 3) / 2;
  }
  uVar8 = iVar7 + uVar8 * 4 + 0x44;
  if (-1 < (int)uVar6) {
    lVar4 = 0;
    do {
      uVar8 = uVar8 + *(int *)((long)puVar3 + lVar4 + 0x28);
      lVar4 = lVar4 + 0x30;
    } while (uVar9 * 0x30 != lVar4);
  }
  if (-1 < (int)uVar6) {
    lVar4 = 0;
    do {
      if (lVar4 == 0) {
        uVar6 = 1;
      }
      else {
        uVar6 = (uint)(*(int *)((long)puVar3 + lVar4 + 0xc) - 0x20U < 3);
      }
      *(uint *)((long)puVar3 + lVar4 + 0x10) = uVar6;
      h265e_nal_encode(dst,(H265eNal *)((long)puVar3 + lVar4 + 8));
      dst = dst + *(int *)((long)puVar3 + lVar4 + 0x1c);
      lVar4 = lVar4 + 0x30;
    } while (uVar9 * 0x30 != lVar4);
  }
  if ((h265e_debug._1_1_ & 2) != 0) {
    _mpp_log_l(4,"h265e_header_gen","nals total size: %d bytes, necessary_size %d",(char *)0x0,
               (long)dst - *(long *)(puVar3 + 0x32),(ulong)uVar8);
  }
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_encapsulate_nals");
  }
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_set_extra_info");
  }
  return MPP_OK;
}

Assistant:

MPP_RET h265e_set_extra_info(H265eCtx *ctx)
{
    H265eExtraInfo *info = (H265eExtraInfo *)ctx->extra_info;
    H265eSps *sps = &ctx->sps;
    H265ePps *pps = &ctx->pps;
    H265eVps *vps = &ctx->vps;

    h265e_dbg_func("enter\n");
    info->nal_num = 0;
    info->temporal_id = 0;
    h265e_stream_reset(&info->stream);

    h265e_nal_start(info, NAL_VPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_vps(ctx, vps);
    h265e_vps_write(vps, &info->stream);
    h265e_nal_end(info);

    h265e_nal_start(info, NAL_SPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_sps(ctx, sps, vps);
    h265e_sps_write(sps, &info->stream);
    h265e_nal_end(info);

    h265e_nal_start(info, NAL_PPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_pps(ctx, pps, sps);
    h265e_pps_write(pps, sps, &info->stream);
    h265e_nal_end(info);

    h265e_encapsulate_nals(info);

    h265e_dbg_func("leave\n");
    return MPP_OK;
}